

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_get_file_comment.c
# Opt level: O0

char * zip_get_file_comment(zip_t *za,zip_uint64_t idx,int *lenp,int flags)

{
  char *pcVar1;
  char *s;
  zip_uint32_t len;
  int flags_local;
  int *lenp_local;
  zip_uint64_t idx_local;
  zip_t *za_local;
  
  s._4_4_ = flags;
  _len = lenp;
  lenp_local = (int *)idx;
  idx_local = (zip_uint64_t)za;
  pcVar1 = zip_file_get_comment(za,idx,(zip_uint32_t *)&s,flags);
  if ((pcVar1 != (char *)0x0) && (_len != (int *)0x0)) {
    *_len = (int)s;
  }
  return pcVar1;
}

Assistant:

ZIP_EXTERN const char *
zip_get_file_comment(zip_t *za, zip_uint64_t idx, int *lenp, int flags) {
    zip_uint32_t len;
    const char *s;

    if ((s = zip_file_get_comment(za, idx, &len, (zip_flags_t)flags)) != NULL) {
	if (lenp)
	    *lenp = (int)len;
    }

    return s;
}